

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS
fun3d_field_scalar(REF_GRID_conflict ref_grid,REF_INT ldim,REF_DBL *initial_field,char *interpolant,
                  REF_DBL *scalar)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  REF_NODE pRVar9;
  undefined8 uVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  double *pdVar14;
  double dVar15;
  REF_DBL RVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  REF_INT solb_ldim;
  REF_DBL *solb_scalar;
  uint local_b8;
  int local_3c;
  REF_DBL *local_38;
  
  ref_mpi = ref_grid->mpi;
  uVar7 = ref_validation_finite(ref_grid,ldim,initial_field);
  if (uVar7 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x9c0,"fun3d_field_scalar",(ulong)uVar7,"init field");
    return uVar7;
  }
  local_b8 = 0;
  if (ref_mpi->id == 0) {
    printf("compute %s\n",interpolant);
  }
  iVar8 = strcmp(interpolant,"incomp");
  bVar6 = false;
  if (iVar8 == 0) {
    if (ldim < 4) {
      pcVar12 = "expected 4 or more variables per vertex for incompressible";
      uVar10 = 0x9c5;
      goto LAB_001279f8;
    }
    pRVar9 = ref_grid->node;
    if (0 < pRVar9->max) {
      pdVar14 = initial_field + 2;
      lVar13 = 0;
      do {
        if (-1 < pRVar9->global[lVar13]) {
          dVar15 = *pdVar14 * *pdVar14 + pdVar14[-2] * pdVar14[-2] + pdVar14[-1] * pdVar14[-1];
          if (dVar15 < 0.0) {
            RVar16 = sqrt(dVar15);
          }
          else {
            RVar16 = SQRT(dVar15);
          }
          scalar[lVar13] = RVar16;
        }
        lVar13 = lVar13 + 1;
        pRVar9 = ref_grid->node;
        pdVar14 = pdVar14 + (uint)ldim;
      } while (lVar13 < pRVar9->max);
    }
    ref_mpi_stopwatch_stop(ref_mpi,"compute incompressible scalar");
    bVar6 = true;
  }
  iVar8 = strcmp(interpolant,"space-time");
  if (iVar8 == 0) {
    if (ldim < 4) {
      pcVar12 = "expected 4 or more variables per vertex for space-time";
      uVar10 = 0x9d3;
      goto LAB_001279f8;
    }
    pRVar9 = ref_grid->node;
    if (pRVar9->max < 1) {
      local_b8 = 0;
    }
    else {
      pdVar14 = initial_field + 3;
      lVar13 = 0;
      local_b8 = 0;
      do {
        if (-1 < pRVar9->global[lVar13]) {
          dVar15 = pdVar14[-3];
          dVar1 = pdVar14[-2];
          dVar2 = pdVar14[-1];
          dVar3 = *pdVar14;
          dVar18 = dVar15 * 1e+20;
          if (dVar18 <= -dVar18) {
            dVar18 = -dVar18;
          }
          dVar17 = dVar3;
          if (dVar3 <= -dVar3) {
            dVar17 = -dVar3;
          }
          if (dVar18 <= dVar17) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x9dc,"fun3d_field_scalar","can not divide by rho");
            printf("rho = %e  u = %e  v = %e  press = %e\n",dVar15,dVar1,dVar2,dVar3);
LAB_00127923:
            bVar6 = false;
            local_b8 = 1;
          }
          else {
            dVar20 = (dVar3 / dVar15) * 1.4;
            dVar17 = dVar1 * dVar1 + dVar2 * dVar2;
            dVar18 = dVar20 * 1e+20;
            if (dVar18 <= -dVar18) {
              dVar18 = -dVar18;
            }
            dVar21 = dVar17;
            if (dVar17 <= -dVar17) {
              dVar21 = -dVar17;
            }
            if (dVar18 <= dVar21) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9e2,"fun3d_field_scalar","can not divide by temp");
              pcVar12 = "rho = %e  u = %e  v = %e  press = %e  temp = %e\n";
LAB_001278fe:
              printf(pcVar12,dVar15,dVar1,dVar2,dVar3,dVar20);
              goto LAB_00127923;
            }
            dVar17 = dVar17 / dVar20;
            if (dVar17 < 0.0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x9e7,"fun3d_field_scalar","negative mach2");
              pcVar12 = "rho = %e  u = %e  v = %e press = %e  temp = %e\n";
              goto LAB_001278fe;
            }
            if (dVar17 < 0.0) {
              RVar16 = sqrt(dVar17);
            }
            else {
              RVar16 = SQRT(dVar17);
            }
            scalar[lVar13] = RVar16;
            bVar6 = true;
          }
          if (!bVar6) {
            return local_b8;
          }
        }
        lVar13 = lVar13 + 1;
        pRVar9 = ref_grid->node;
        pdVar14 = pdVar14 + (uint)ldim;
      } while (lVar13 < pRVar9->max);
    }
    ref_mpi_stopwatch_stop(ref_mpi,"compute incompressible scalar");
    bVar6 = true;
  }
  iVar8 = strcmp(interpolant,"mach");
  if (((((iVar8 == 0) || (iVar8 = strcmp(interpolant,"htot"), iVar8 == 0)) ||
       (iVar8 = strcmp(interpolant,"ptot"), iVar8 == 0)) ||
      ((iVar8 = strcmp(interpolant,"pressure"), iVar8 == 0 ||
       (iVar8 = strcmp(interpolant,"density"), iVar8 == 0)))) ||
     (iVar8 = strcmp(interpolant,"temperature"), iVar8 == 0)) {
    if (ldim < 5) {
      pcVar12 = "expected 5 or more variables per vertex for compressible";
      uVar10 = 0x9f2;
LAB_001279f8:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar10,"fun3d_field_scalar",pcVar12);
      return 1;
    }
    pRVar9 = ref_grid->node;
    if (0 < pRVar9->max) {
      pdVar14 = initial_field + 4;
      lVar13 = 0;
      do {
        if (-1 < pRVar9->global[lVar13]) {
          dVar15 = pdVar14[-4];
          dVar1 = pdVar14[-3];
          dVar2 = pdVar14[-2];
          dVar3 = pdVar14[-1];
          dVar18 = *pdVar14;
          dVar17 = dVar15 * 1e+20;
          if (dVar17 <= -dVar17) {
            dVar17 = -dVar17;
          }
          dVar20 = dVar18;
          if (dVar18 <= -dVar18) {
            dVar20 = -dVar18;
          }
          if (dVar17 <= dVar20) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x9fd,"fun3d_field_scalar","can not divide by rho");
            printf("rho = %e  u = %e  v = %e  w = %e  press = %e\n",dVar15,dVar1,dVar2,dVar3,dVar18)
            ;
LAB_001274c8:
            bVar5 = false;
            local_b8 = 1;
          }
          else {
            dVar20 = (dVar18 / dVar15) * 1.4;
            dVar21 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
            dVar17 = dVar20 * 1e+20;
            if (dVar17 <= -dVar17) {
              dVar17 = -dVar17;
            }
            dVar19 = dVar21;
            if (dVar21 <= -dVar21) {
              dVar19 = -dVar21;
            }
            if (dVar17 <= dVar19) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xa03,"fun3d_field_scalar","can not divide by temp");
              printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n",dVar15,dVar1,dVar2,
                     dVar3,dVar18,dVar20);
              goto LAB_001274c8;
            }
            dVar17 = dVar21 / dVar20;
            if (0.0 <= dVar17) {
              iVar8 = strcmp(interpolant,"mach");
              if (iVar8 == 0) {
                if (dVar17 < 0.0) {
                  RVar16 = sqrt(dVar17);
                }
                else {
                  RVar16 = SQRT(dVar17);
                }
                scalar[lVar13] = RVar16;
                bVar6 = true;
                bVar5 = true;
              }
              else {
                iVar8 = strcmp(interpolant,"htot");
                if (iVar8 == 0) {
                  dVar18 = dVar20 * 2.5000000000000004 + dVar21 * 0.5;
LAB_00127664:
                  scalar[lVar13] = dVar18;
LAB_0012766a:
                  bVar6 = true;
                }
                else {
                  iVar8 = strcmp(interpolant,"ptot");
                  if (iVar8 == 0) {
                    dVar15 = pow(dVar17 * 0.19999999999999996 + 1.0,3.5000000000000004);
                    scalar[lVar13] = dVar18 * dVar15;
                    goto LAB_0012766a;
                  }
                  iVar8 = strcmp(interpolant,"pressure");
                  if ((iVar8 == 0) ||
                     (iVar8 = strcmp(interpolant,"density"), dVar18 = dVar15, iVar8 == 0))
                  goto LAB_00127664;
                  iVar8 = strcmp(interpolant,"temperature");
                  if (iVar8 == 0) {
                    scalar[lVar13] = dVar20;
                    bVar6 = true;
                  }
                }
                bVar5 = true;
              }
            }
            else {
              bVar5 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xa08,"fun3d_field_scalar","negative mach2");
              printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n",dVar15,dVar1,dVar2,
                     dVar3,dVar18,dVar20);
              local_b8 = 1;
            }
          }
          if (!bVar5) {
            return local_b8;
          }
        }
        lVar13 = lVar13 + 1;
        pRVar9 = ref_grid->node;
        pdVar14 = pdVar14 + (uint)ldim;
      } while (lVar13 < pRVar9->max);
    }
    if (bVar6) {
      ref_mpi_stopwatch_stop(ref_mpi,"compute compressible scalar");
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
  }
  if (bVar6) {
    return 0;
  }
  if (ref_mpi->id == 0) {
    printf("opening %s as solb multiscale interpolant\n",interpolant);
  }
  uVar7 = ref_part_scalar(ref_grid,&local_3c,&local_38,interpolant);
  if (uVar7 == 0) {
    if ((long)local_3c != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xa29,"fun3d_field_scalar","expected one interpolant scalar",1,(long)local_3c);
      local_b8 = 1;
    }
    if (local_3c == 1) {
      lVar13 = (long)ref_grid->node->max;
      if (0 < lVar13) {
        pRVar4 = ref_grid->node->global;
        lVar11 = 0;
        do {
          if (-1 < pRVar4[lVar11]) {
            scalar[lVar11] = local_38[lVar11];
          }
          lVar11 = lVar11 + 1;
        } while (lVar13 != lVar11);
      }
      if (local_38 != (REF_DBL *)0x0) {
        free(local_38);
      }
      ref_mpi_stopwatch_stop(ref_mpi,"read interpolant from file");
      bVar6 = true;
      goto LAB_00127b3f;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xa28,"fun3d_field_scalar",(ulong)uVar7,"unable to load interpolant scalar");
    local_b8 = uVar7;
  }
  bVar6 = false;
LAB_00127b3f:
  if (bVar6) {
    return 0;
  }
  return local_b8;
}

Assistant:

static REF_STATUS fun3d_field_scalar(REF_GRID ref_grid, REF_INT ldim,
                                     REF_DBL *initial_field,
                                     const char *interpolant, REF_DBL *scalar) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_DBL gamma = 1.4;
  REF_BOOL recognized = REF_FALSE;

  RSS(ref_validation_finite(ref_grid, ldim, initial_field), "init field");
  if (ref_mpi_once(ref_mpi)) printf("compute %s\n", interpolant);
  if (strcmp(interpolant, "incomp") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim,
        "expected 4 or more variables per vertex for incompressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL u, v, w, u2;
      u = initial_field[0 + ldim * node];
      v = initial_field[1 + ldim * node];
      w = initial_field[2 + ldim * node];
      /* press = initial_field[3 + ldim * node]; */
      u2 = u * u + v * v + w * w;
      scalar[node] = sqrt(u2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if (strcmp(interpolant, "space-time") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim, "expected 4 or more variables per vertex for space-time");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      press = initial_field[3 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  press = %e\n", rho, u, v, press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      scalar[node] = sqrt(mach2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if ((strcmp(interpolant, "mach") == 0) ||
      (strcmp(interpolant, "htot") == 0) ||
      (strcmp(interpolant, "ptot") == 0) ||
      (strcmp(interpolant, "pressure") == 0) ||
      (strcmp(interpolant, "density") == 0) ||
      (strcmp(interpolant, "temperature") == 0)) {
    RAS(5 <= ldim, "expected 5 or more variables per vertex for compressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, w, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      w = initial_field[3 + ldim * node];
      press = initial_field[4 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e\n", rho, u, v, w,
               press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v + w * w;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      if (strcmp(interpolant, "mach") == 0) {
        recognized = REF_TRUE;
        scalar[node] = sqrt(mach2);
      } else if (strcmp(interpolant, "htot") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp * (1.0 / (gamma - 1.0)) + 0.5 * u2;
      } else if (strcmp(interpolant, "ptot") == 0) {
        recognized = REF_TRUE;
        scalar[node] =
            press * pow(1.0 + 0.5 * (gamma - 1.0) * mach2, gamma / (gamma - 1));
      } else if (strcmp(interpolant, "pressure") == 0) {
        recognized = REF_TRUE;
        scalar[node] = press;
      } else if (strcmp(interpolant, "density") == 0) {
        recognized = REF_TRUE;
        scalar[node] = rho;
      } else if (strcmp(interpolant, "temperature") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp;
      }
    }
    if (recognized)
      ref_mpi_stopwatch_stop(ref_mpi, "compute compressible scalar");
  }

  if (!recognized) {
    REF_INT solb_ldim;
    REF_DBL *solb_scalar;
    if (ref_mpi_once(ref_mpi))
      printf("opening %s as solb multiscale interpolant\n", interpolant);
    RSS(ref_part_scalar(ref_grid, &solb_ldim, &solb_scalar, interpolant),
        "unable to load interpolant scalar");
    REIS(1, solb_ldim, "expected one interpolant scalar");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      scalar[node] = solb_scalar[node];
    }
    ref_free(solb_scalar);
    ref_mpi_stopwatch_stop(ref_mpi, "read interpolant from file");
  }

  return REF_SUCCESS;
}